

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeBase * ApplyArraySizesToType(ExpressionContext *ctx,TypeBase *type,SynBase *sizes)

{
  bool bVar1;
  ExprBase *pEVar2;
  TypeArray *pTVar3;
  TypeUnsizedArray *pTVar4;
  TypeBase *pTVar5;
  uint uVar6;
  char *pcVar7;
  SynBase *syntax;
  
  syntax = (SynBase *)0x0;
  if ((sizes != (SynBase *)0x0) && (sizes->typeID != 3)) {
    syntax = sizes;
  }
  if (sizes->next != (SynBase *)0x0) {
    type = ApplyArraySizesToType(ctx,type,sizes->next);
  }
  if ((type == (TypeBase *)0x0) || (type->typeID != 0xe)) {
    if (type == ctx->typeVoid) {
      pcVar7 = "ERROR: cannot specify array size for void";
      syntax = sizes;
    }
    else if (syntax == (SynBase *)0x0) {
      if (type->size < 0x10000) {
        pTVar4 = ExpressionContext::GetUnsizedArrayType(ctx,type);
        return (TypeBase *)pTVar4;
      }
      pcVar7 = "ERROR: array element size cannot exceed 65535 bytes";
      syntax = sizes;
    }
    else {
      pEVar2 = AnalyzeExpression(ctx,syntax);
      pEVar2 = CreateCast(ctx,syntax,pEVar2,ctx->typeLong,false);
      pEVar2 = anon_unknown.dwarf_b837c::EvaluateExpression(ctx,syntax,pEVar2);
      if ((pEVar2 == (ExprBase *)0x0) || (pEVar2->typeID != 6)) {
        pcVar7 = "ERROR: array size cannot be evaluated";
      }
      else if ((long)pEVar2[1]._vptr_ExprBase < 1) {
        pcVar7 = "ERROR: array size can\'t be negative or zero";
      }
      else {
        if ((type != (TypeBase *)0x0) && (type->typeID == 0x18)) {
          if (*(char *)&type[3]._vptr_TypeBase == '\0') {
            uVar6 = *(int *)&(type->name).end - (int)(type->name).begin;
            pcVar7 = "ERROR: type \'%.*s\' is not fully defined";
LAB_0015e941:
            anon_unknown.dwarf_b837c::Stop(ctx,syntax,pcVar7,(ulong)uVar6);
          }
          if (*(char *)((long)&type[3]._vptr_TypeBase + 2) == '\x01') {
            uVar6 = *(int *)&(type->name).end - (int)(type->name).begin;
            pcVar7 = 
            "ERROR: class \'%.*s\' implements \'finalize\' so only an unsized array type can be created"
            ;
            goto LAB_0015e941;
          }
        }
        if (type->size < 0x10000) {
          bVar1 = AssertResolvableType(ctx,syntax,type,true);
          if (!bVar1) {
            pTVar5 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
            return pTVar5;
          }
          pTVar3 = ExpressionContext::GetArrayType(ctx,type,(longlong)pEVar2[1]._vptr_ExprBase);
          return &pTVar3->super_TypeBase;
        }
        pcVar7 = "ERROR: array element size cannot exceed 65535 bytes";
      }
    }
  }
  else {
    if (syntax == (SynBase *)0x0) {
      return &ctx->typeAutoArray->super_TypeBase;
    }
    pcVar7 = "ERROR: cannot specify array size for auto";
  }
  anon_unknown.dwarf_b837c::Stop(ctx,syntax,pcVar7);
}

Assistant:

TypeBase* ApplyArraySizesToType(ExpressionContext &ctx, TypeBase *type, SynBase *sizes)
{
	SynBase *size = sizes;

	if(isType<SynNothing>(size))
		size = NULL;

	if(sizes->next)
		type = ApplyArraySizesToType(ctx, type, sizes->next);

	if(isType<TypeAuto>(type))
	{
		if(size)
			Stop(ctx, size, "ERROR: cannot specify array size for auto");

		return ctx.typeAutoArray;
	}

	if(type == ctx.typeVoid)
		Stop(ctx, sizes, "ERROR: cannot specify array size for void");

	if(!size)
	{
		if(type->size >= 64 * 1024)
			Stop(ctx, sizes, "ERROR: array element size cannot exceed 65535 bytes");

		return ctx.GetUnsizedArrayType(type);
	}

	ExprBase *sizeValue = AnalyzeExpression(ctx, size);

	if(ExprIntegerLiteral *number = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, size, CreateCast(ctx, size, sizeValue, ctx.typeLong, false))))
	{
		if(number->value <= 0)
			Stop(ctx, size, "ERROR: array size can't be negative or zero");

		if(TypeClass *typeClass = getType<TypeClass>(type))
		{
			if(!typeClass->completed)
				Stop(ctx, size, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(type->name));

			if(typeClass->hasFinalizer)
				Stop(ctx, size, "ERROR: class '%.*s' implements 'finalize' so only an unsized array type can be created", FMT_ISTR(type->name));
		}

		if(type->size >= 64 * 1024)
			Stop(ctx, size, "ERROR: array element size cannot exceed 65535 bytes");

		if(!AssertResolvableType(ctx, size, type, true))
			return ctx.GetErrorType();

		return ctx.GetArrayType(type, number->value);
	}

	Stop(ctx, size, "ERROR: array size cannot be evaluated");

	return NULL;
}